

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

size_t dg::vr::limitingBorder(ValueRelations *relations,Value *val)

{
  size_t sVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_bitset<1UL> local_68;
  Value *local_60;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_58;
  
  local_68._M_w = 4;
  local_60 = val;
  ValueRelations::getRelated<llvm::Value_const*>
            ((RelationsMap *)&local_58,relations,&local_60,(Relations *)&local_68);
  p_Var2 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((sVar1 = 0xffffffffffffffff,
         (_Rb_tree_header *)p_Var2 != &local_58._M_impl.super__Rb_tree_header &&
         (sVar1 = ValueRelations::getBorderId(relations,*(Handle *)(p_Var2 + 1)),
         sVar1 == 0xffffffffffffffff))) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::_M_erase(&local_58,(_Link_type)local_58._M_impl.super__Rb_tree_header._M_header._M_parent);
  return sVar1;
}

Assistant:

size_t limitingBorder(const ValueRelations &relations, const llvm::Value *val) {
    for (const auto &handleRel : relations.getRelated(val, Relations().sle())) {
        auto mId = relations.getBorderId(handleRel.first);
        if (mId != std::string::npos)
            return mId;
    }
    return std::string::npos;
}